

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::Test::HasSameFixtureClass(void)

{
  char *pcVar1;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *this;
  const_reference ppTVar2;
  char *pcVar3;
  char *pcVar4;
  Message *pMVar5;
  TestInfo *local_c8;
  TestInfo *local_c0;
  AssertHelper local_a8;
  char *local_a0;
  Message local_98;
  AssertHelper local_90;
  char *local_88 [3];
  Message local_70;
  TestInfo *local_68;
  char *TEST_F_name;
  char *TEST_name;
  bool this_is_TEST;
  TestInfo *pTStack_50;
  bool first_is_TEST;
  char *this_test_name;
  TypeId this_fixture_id;
  TestInfo *this_test_info;
  char *first_test_name;
  TypeId first_fixture_id;
  TestInfo *first_test_info;
  TestSuite *test_suite;
  UnitTestImpl *impl;
  
  test_suite = (TestSuite *)internal::GetUnitTestImpl();
  first_test_info =
       (TestInfo *)internal::UnitTestImpl::current_test_suite((UnitTestImpl *)test_suite);
  this = TestSuite::test_info_list((TestSuite *)first_test_info);
  ppTVar2 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                      (this,0);
  first_fixture_id = *ppTVar2;
  first_test_name = (char *)((TestInfo *)first_fixture_id)->fixture_class_id_;
  this_test_info = (TestInfo *)TestInfo::name((TestInfo *)first_fixture_id);
  this_fixture_id = internal::UnitTestImpl::current_test_info((UnitTestImpl *)test_suite);
  this_test_name = (char *)((TestInfo *)this_fixture_id)->fixture_class_id_;
  pTStack_50 = (TestInfo *)TestInfo::name((TestInfo *)this_fixture_id);
  pcVar4 = first_test_name;
  if (this_test_name == first_test_name) {
    impl._7_1_ = true;
  }
  else {
    pcVar3 = (char *)internal::GetTestTypeId();
    pcVar1 = this_test_name;
    TEST_name._7_1_ = pcVar4 == pcVar3;
    pcVar4 = (char *)internal::GetTestTypeId();
    TEST_name._6_1_ = pcVar1 == pcVar4;
    if (((TEST_name._7_1_ & 1) != 0) || ((bool)TEST_name._6_1_)) {
      if ((TEST_name._7_1_ & 1) == 0) {
        local_c0 = pTStack_50;
      }
      else {
        local_c0 = this_test_info;
      }
      TEST_F_name = (char *)local_c0;
      if ((TEST_name._7_1_ & 1) == 0) {
        local_c8 = this_test_info;
      }
      else {
        local_c8 = pTStack_50;
      }
      local_68 = local_c8;
      Message::Message(&local_70);
      pMVar5 = Message::operator<<(&local_70,
                                   (char (*) [65])
                                   "All tests in the same test suite must use the same test fixture\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [60])
                                          "class, so mixing TEST_F and TEST in the same test suite is\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [25])"illegal.  In test suite ");
      local_88[0] = TestInfo::test_suite_name((TestInfo *)this_fixture_id);
      pMVar5 = Message::operator<<(pMVar5,local_88);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [3])0x3a8f49);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])0x3a86fc);
      pMVar5 = Message::operator<<(pMVar5,(char **)&local_68);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [30])" is defined using TEST_F but\n");
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])0x3a86fc);
      pMVar5 = Message::operator<<(pMVar5,&TEST_F_name);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [39])" is defined using TEST.  You probably\n");
      pMVar5 = Message::operator<<(pMVar5,(char (*) [62])
                                          "want to change the TEST to TEST_F or move it to another test\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [6])"case.");
      internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/src/gtest.cc"
                 ,0x9c8,"Failed");
      internal::AssertHelper::operator=(&local_90,pMVar5);
      internal::AssertHelper::~AssertHelper(&local_90);
      Message::~Message(&local_70);
    }
    else {
      Message::Message(&local_98);
      pMVar5 = Message::operator<<(&local_98,
                                   (char (*) [65])
                                   "All tests in the same test suite must use the same test fixture\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [32])"class.  However, in test suite ");
      local_a0 = TestInfo::test_suite_name((TestInfo *)this_fixture_id);
      pMVar5 = Message::operator<<(pMVar5,&local_a0);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [3])0x3a8f49);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [18])"you defined test ");
      pMVar5 = Message::operator<<(pMVar5,(char **)&this_test_info);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [11])" and test ");
      pMVar5 = Message::operator<<(pMVar5,(char **)&stack0xffffffffffffffb0);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [2])0x3bd2cc);
      pMVar5 = Message::operator<<(pMVar5,(char (*) [63])
                                          "using two different test fixture classes.  This can happen if\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [62])
                                          "the two classes are from different namespaces or translation\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [63])
                                          "units and have the same name.  You should probably rename one\n"
                                  );
      pMVar5 = Message::operator<<(pMVar5,(char (*) [60])
                                          "of the classes to put the tests into different test suites."
                                  );
      internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/src/gtest.cc"
                 ,0x9d4,"Failed");
      internal::AssertHelper::operator=(&local_a8,pMVar5);
      internal::AssertHelper::~AssertHelper(&local_a8);
      Message::~Message(&local_98);
    }
    impl._7_1_ = false;
  }
  return impl._7_1_;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestSuite* const test_suite = impl->current_test_suite();

  // Info about the first test in the current test suite.
  const TestInfo* const first_test_info = test_suite->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // Both TEST and TEST_F appear in same test suite, which is incorrect.
      // Tell the user how to fix this.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test suite is\n"
          << "illegal.  In test suite " << this_test_info->test_suite_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // Two fixture classes with the same name appear in two different
      // namespaces, which is not allowed. Tell the user how to fix this.
      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class.  However, in test suite "
          << this_test_info->test_suite_name() << ",\n"
          << "you defined test " << first_test_name << " and test "
          << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test suites.";
    }
    return false;
  }

  return true;
}